

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast_withPrefix64k(char *source,char *dest,int originalSize)

{
  char *pcVar1;
  byte bVar2;
  ushort uVar3;
  ushort *puVar4;
  ulong uVar5;
  size_t l_1;
  uint uVar6;
  size_t l;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  byte *__src;
  ushort *puVar11;
  int local_40;
  
  pcVar9 = dest + originalSize;
  pcVar1 = dest + -0x10000;
  local_40 = -1;
  puVar4 = (ushort *)source;
  while( true ) {
    uVar3 = *puVar4;
    __src = (byte *)((long)puVar4 + 1);
    uVar6 = (uint)(byte)((byte)uVar3 >> 4);
    uVar8 = (ulong)uVar6;
    if (uVar6 == 0xf) {
      lVar7 = 0;
      do {
        bVar2 = *__src;
        __src = __src + 1;
        lVar7 = lVar7 + (ulong)bVar2;
      } while ((ulong)bVar2 == 0xff);
      uVar8 = lVar7 + 0xf;
    }
    if ((ulong)((long)pcVar9 - (long)dest) < uVar8) {
      return -1;
    }
    memmove(dest,__src,uVar8);
    pcVar10 = dest + uVar8;
    puVar11 = (ushort *)(__src + uVar8);
    if ((ulong)((long)pcVar9 - (long)pcVar10) < 0xc) {
      if (pcVar10 == pcVar9) {
        local_40 = (int)source;
        local_40 = (int)puVar11 - local_40;
      }
      return local_40;
    }
    uVar8 = (ulong)((byte)uVar3 & 0xf);
    puVar4 = puVar11 + 1;
    if (uVar8 == 0xf) {
      lVar7 = 0;
      do {
        uVar3 = *puVar4;
        puVar4 = (ushort *)((long)puVar4 + 1);
        lVar7 = lVar7 + (ulong)(byte)uVar3;
      } while ((ulong)(byte)uVar3 == 0xff);
      uVar8 = lVar7 + 0xf;
    }
    uVar8 = uVar8 + 4;
    if ((ulong)((long)pcVar9 - (long)pcVar10) < uVar8) break;
    uVar3 = *puVar11;
    if ((ulong)((long)pcVar10 - (long)pcVar1) < (ulong)uVar3) {
      return -1;
    }
    if (uVar8 != 0) {
      uVar5 = 0;
      do {
        pcVar10[uVar5] = pcVar10[uVar5 - uVar3];
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
    dest = pcVar10 + uVar8;
    if ((ulong)((long)pcVar9 - (long)dest) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int LZ4_decompress_fast_withPrefix64k(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                64 KB, NULL, 0);
}